

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall
ON_AngularDimension2Extra::Read(ON_AngularDimension2Extra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int minor_version;
  int major_version;
  int local_28 [2];
  
  local_28[0] = 0;
  local_28[1] = 1;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_28 + 1,local_28);
  bVar2 = local_28[1] == 1 && bVar1;
  if (local_28[1] == 1 && bVar1) {
    bVar2 = ON_BinaryArchive::ReadDouble(archive,this->m_dimpoint_offset);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::ReadDouble(archive,this->m_dimpoint_offset + 1);
  }
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool ON_AngularDimension2Extra::Read(ON_BinaryArchive& archive)
{
  int major_version = 1;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if(major_version != 1)
    rc = false;

  if(rc) rc = archive.ReadDouble(&m_dimpoint_offset[0]);
  if(rc) rc = archive.ReadDouble(&m_dimpoint_offset[1]);

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}